

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp-wasm-c-api.cc
# Opt level: O3

wasm_externkind_t wasm_extern_kind(wasm_extern_t *extern_)

{
  Object *pOVar1;
  wasm_externkind_t wVar2;
  int iVar3;
  undefined4 extraout_var;
  
  pOVar1 = (extern_->super_wasm_ref_t).I.obj_;
  if (pOVar1->kind_ - DefinedFunc < 6) {
    iVar3 = (*pOVar1->_vptr_Object[4])();
    wVar2 = FromWabtExternKind(*(ExternKind *)(CONCAT44(extraout_var,iVar3) + 8));
    return wVar2;
  }
  __assert_fail("isa<Derived>(base)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/asbish[P]wabt/src/cast.h",
                0x4e,
                "Derived *wabt::cast(Base *) [Derived = wabt::interp::Extern, Base = wabt::interp::Object]"
               );
}

Assistant:

wasm_externkind_t wasm_extern_kind(const wasm_extern_t* extern_) {
  return FromWabtExternKind(extern_->As<Extern>()->extern_type().kind);
}